

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall Am_Object::~Am_Object(Am_Object *this)

{
  Am_Object_Data *this_00;
  ostream *poVar1;
  
  this_00 = this->data;
  if (this_00 != (Am_Object_Data *)0x0) {
    if ((this_00->super_Am_Wrapper).refs == 0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar1 = std::operator<<(poVar1,"** Tried to delete object twice.");
      Print(this,poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      Am_Error();
    }
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  this->data = (Am_Object_Data *)0x0;
  return;
}

Assistant:

Am_Object::~Am_Object()
{
  if (data) {
    if (data->Is_Zero())
      Am_ERROR("** Tried to delete object twice." << *this);
    data->Release();
  }
  data = nullptr;
}